

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O0

bool nuraft::raft_server::apply_config_log_entry
               (ptr<log_entry> *le,ptr<state_mgr> *s_mgr,string *err_msg)

{
  log_val_type lVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  element_type *peVar7;
  string *in_RDX;
  __shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  __shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  ptr<cluster_config> new_conf;
  buffer *buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  char *in_stack_ffffffffffffff68;
  log_entry *in_stack_ffffffffffffff70;
  buffer *in_stack_ffffffffffffff78;
  buffer *in_stack_ffffffffffffff80;
  string local_60 [12];
  int in_stack_ffffffffffffffac;
  string local_40 [32];
  string *local_20;
  __shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2> *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  peVar3 = std::__shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>::get(in_RDI);
  if (peVar3 != (element_type *)0x0) {
    peVar4 = std::__shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>::get(local_18);
    if (peVar4 != (element_type *)0x0) {
      peVar5 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x195883);
      lVar1 = log_entry::get_val_type(peVar5);
      if (lVar1 == conf) {
        std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x195933);
        bVar2 = log_entry::is_buf_null((log_entry *)0x19593b);
        if (bVar2) {
          std::__cxx11::string::operator=(local_20,"Context is empty");
          local_1 = 0;
        }
        else {
          std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x19596f);
          log_entry::get_buf(in_stack_ffffffffffffff70);
          buffer::pos(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78);
          this = (__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&stack0xffffffffffffff78;
          cluster_config::deserialize(in_stack_ffffffffffffff78);
          peVar6 = std::
                   __shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1959ab);
          peVar7 = std::
                   __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*(this);
          (*peVar6->_vptr_state_mgr[3])(peVar6,peVar7);
          local_1 = 1;
          std::shared_ptr<nuraft::cluster_config>::~shared_ptr
                    ((shared_ptr<nuraft::cluster_config> *)0x1959df);
        }
      }
      else {
        peVar5 = std::
                 __shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1958a4);
        log_entry::get_val_type(peVar5);
        std::__cxx11::to_string(in_stack_ffffffffffffffac);
        std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        std::__cxx11::string::operator=(local_20,local_40);
        std::__cxx11::string::~string(local_40);
        std::__cxx11::string::~string(local_60);
        local_1 = 0;
      }
      goto LAB_001959fb;
    }
  }
  std::__cxx11::string::operator=(local_20,"Invalid arguments");
  local_1 = 0;
LAB_001959fb:
  return (bool)(local_1 & 1);
}

Assistant:

bool raft_server::apply_config_log_entry(ptr<log_entry>& le,
                                         ptr<state_mgr>& s_mgr,
                                         std::string& err_msg)
{
    if (!le.get() || !s_mgr.get()) {
        err_msg = "Invalid arguments";
        return false;
    }
    if (le->get_val_type() != log_val_type::conf) {
        err_msg = "Invalid log type: " + std::to_string(le->get_val_type());
        return false;
    }
    if (le->is_buf_null()) {
        err_msg = "Context is empty";
        return false;
    }

    buffer& buf = le->get_buf();
    buf.pos(0);
    ptr<cluster_config> new_conf = cluster_config::deserialize(buf);
    s_mgr->save_config(*new_conf);
    return true;
}